

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O0

void __thiscall create::Serial::signalHandler(Serial *this,error_code *error,int signal_number)

{
  bool bVar1;
  Opcode local_24 [3];
  error_code *peStack_18;
  int signal_number_local;
  error_code *error_local;
  Serial *this_local;
  
  local_24[2] = signal_number;
  peStack_18 = error;
  error_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(error);
  if ((!bVar1) && (bVar1 = connected(this), bVar1)) {
    local_24[1] = 0x80;
    sendOpcode(this,local_24 + 1);
    local_24[0] = OC_STOP;
    sendOpcode(this,local_24);
    exit(local_24[2]);
  }
  return;
}

Assistant:

void Serial::signalHandler(const boost::system::error_code& error, int signal_number) {
    if (!error) {
      if (connected()) {
        // Ensure not in Safe/Full modes
        sendOpcode(OC_START);
        // Stop OI
        sendOpcode(OC_STOP);
        exit(signal_number);
      }
    }
  }